

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::ThreadSafeArena::ThreadSafeArena
          (ThreadSafeArena *this,void *mem,size_t size,AllocationPolicy *policy)

{
  ArenaBlock *pAVar1;
  
  this->tag_and_id_ = 0;
  (this->alloc_policy_).policy_ = 0;
  (this->mutex_).mu_.super___atomic_base<long>._M_i = 0;
  (this->head_)._M_b._M_p = (__pointer_type)0x0;
  pAVar1 = FirstBlock(this,mem,size,policy);
  SerialArena::SerialArena(&this->first_arena_,pAVar1,this);
  InitializeWithPolicy(this,policy);
  return;
}

Assistant:

ThreadSafeArena::ThreadSafeArena(void* mem, size_t size,
                                 const AllocationPolicy& policy)
    : first_arena_(FirstSerialArena{}, FirstBlock(mem, size, policy), *this) {
  InitializeWithPolicy(policy);
}